

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O3

void replay_term(global_state_t *g)

{
  __cilkrts_worker *p_Var1;
  replay_entry_t *prVar2;
  local_state *plVar3;
  replay_entry_t *ptr;
  long lVar4;
  
  if (g->record_replay_file_name != (char *)0x0) {
    __cilkrts_free(g->record_replay_file_name);
  }
  if (0 < g->total_workers) {
    lVar4 = 0;
    do {
      p_Var1 = g->workers[lVar4];
      plVar3 = p_Var1->l;
      if ((FILE *)plVar3->record_replay_fptr != (FILE *)0x0) {
        fclose((FILE *)plVar3->record_replay_fptr);
        plVar3 = p_Var1->l;
      }
      ptr = plVar3->replay_list_root;
      if (ptr != (replay_entry_t *)0x0) {
        if (plVar3->replay_list_entry->m_type != ped_type_last) {
          replay_term_cold_1();
        }
        if (ptr->m_type != ped_type_last) {
          do {
            __cilkrts_free(ptr->m_reverse_pedigree);
            ptr->m_reverse_pedigree = (uint64_t *)0x0;
            prVar2 = ptr + 1;
            ptr = ptr + 1;
          } while (prVar2->m_type != ped_type_last);
          ptr = p_Var1->l->replay_list_root;
        }
        __cilkrts_free(ptr);
        plVar3 = p_Var1->l;
        plVar3->replay_list_root = (replay_entry_t *)0x0;
        plVar3->replay_list_entry = (replay_entry_t *)0x0;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < g->total_workers);
  }
  return;
}

Assistant:

void replay_term(global_state_t *g)
{
    // Free memory for the record/replay log file name, if we've got one
    if (g->record_replay_file_name)
        __cilkrts_free(g->record_replay_file_name);

    // Per-worker cleanup
    for(int i = 0; i < g->total_workers; ++i)
    {
        __cilkrts_worker *w = g->workers[i];

        // Close the log files, if we've opened them
        if(w->l->record_replay_fptr)
            fclose(w->l->record_replay_fptr);

        if (w->l->replay_list_root)
        {
            // We should have consumed the entire list
            CILK_ASSERT(ped_type_last == w->l->replay_list_entry->m_type);

            replay_entry_t *entry = w->l->replay_list_root;
            while (ped_type_last != entry->m_type)
            {
                // Free the pedigree memory for each entry
                entry->unload();
                entry++;
            }
            __cilkrts_free(w->l->replay_list_root);
            w->l->replay_list_root = NULL;
            w->l->replay_list_entry = NULL;
        }
    }
}